

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

IdHideMap * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectFieldsAux
          (IdHideMap *__return_storage_ptr__,Interpreter *this,HeapObject *obj_)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__k;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  HeapObject *obj__00;
  mapped_type mVar8;
  undefined1 auVar9 [16];
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  _Stack_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar5 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (this != (Interpreter *)0x0) {
    auVar9 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                            &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
    obj_ = auVar9._8_8_;
    lVar5 = auVar9._0_8_;
  }
  if (lVar5 == 0) {
    if (this == (Interpreter *)0x0) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = obj_;
      auVar9 = auVar9 << 0x40;
    }
    else {
      auVar9 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                              &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
    }
    lVar5 = auVar9._0_8_;
    if (lVar5 == 0) {
      if (this == (Interpreter *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                               &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
      }
      if (lVar5 != 0) {
        for (p_Var3 = *(_Rb_tree_node_base **)(lVar5 + 0x68);
            p_Var3 != (_Rb_tree_node_base *)(lVar5 + 0x58);
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
          pmVar2 = std::
                   map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)(p_Var3 + 1));
          *pmVar2 = INHERIT;
        }
      }
    }
    else {
      objectFieldsAux((IdHideMap *)&_Stack_58,*(Interpreter **)(lVar5 + 0x18),auVar9._8_8_);
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
      ::clear(&__return_storage_ptr__->_M_t);
      if (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var7 = &_Stack_58._M_impl.super__Rb_tree_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
             _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
             _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right;
        (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var1->_M_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
             _Stack_58._M_impl.super__Rb_tree_header._M_node_count;
        _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
        _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
      }
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
      ::~_Rb_tree(&_Stack_58);
      objectFieldsAux((IdHideMap *)&_Stack_58,*(Interpreter **)(lVar5 + 0x10),obj__00);
      for (p_Var3 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &_Stack_58._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        __k = p_Var3 + 1;
        p_Var6 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 = &p_Var1->_M_header;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            if (*(key_type *)(p_Var6 + 1) >= *(key_type *)__k) {
              p_Var4 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[*(key_type *)(p_Var6 + 1) < *(key_type *)__k];
          } while (p_Var6 != (_Base_ptr)0x0);
        }
        p_Var7 = p_Var1;
        if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
           (p_Var7 = (_Rb_tree_header *)p_Var4,
           *(key_type *)__k < (key_type)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
          p_Var7 = p_Var1;
        }
        if (p_Var7 == p_Var1) {
          mVar8 = *(mapped_type *)&p_Var3[1]._M_parent;
          pmVar2 = std::
                   map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)__k);
LAB_001c6dc8:
          *pmVar2 = mVar8;
        }
        else if (*(int *)(p_Var7 + 1) == 1) {
          mVar8 = *(mapped_type *)&p_Var3[1]._M_parent;
          pmVar2 = std::
                   map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)__k);
          goto LAB_001c6dc8;
        }
      }
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
      ::~_Rb_tree(&_Stack_58);
    }
  }
  else {
    for (p_Var3 = *(_Rb_tree_node_base **)(lVar5 + 0x58);
        p_Var3 != (_Rb_tree_node_base *)(lVar5 + 0x48);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      mVar8 = *(mapped_type *)&p_Var3[1]._M_parent;
      pmVar2 = std::
               map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var3 + 1));
      *pmVar2 = mVar8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IdHideMap objectFieldsAux(const HeapObject *obj_)
    {
        IdHideMap r;
        if (auto *obj = dynamic_cast<const HeapSimpleObject *>(obj_)) {
            for (const auto &f : obj->fields) {
                r[f.first] = f.second.hide;
            }

        } else if (auto *obj = dynamic_cast<const HeapExtendedObject *>(obj_)) {
            r = objectFieldsAux(obj->right);
            for (const auto &pair : objectFieldsAux(obj->left)) {
                auto it = r.find(pair.first);
                if (it == r.end()) {
                    // First time it is seen
                    r[pair.first] = pair.second;
                } else if (it->second == ObjectField::INHERIT) {
                    // Seen before, but with inherited visibility so use new visibility
                    r[pair.first] = pair.second;
                }
            }

        } else if (auto *obj = dynamic_cast<const HeapComprehensionObject *>(obj_)) {
            for (const auto &f : obj->compValues)
                r[f.first] = ObjectField::INHERIT;
        }
        return r;
    }